

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_test_interface.h
# Opt level: O2

void __thiscall
google::
HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::HashtableInterface_DenseHashMap
          (HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *this,size_type expected_max_items,hasher *hf,key_equal *eql,allocator_type *alloc)

{
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::BaseHashtableInterface
            (&this->
              super_BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ,expected_max_items,hf,eql,alloc);
  (this->
  super_BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  )._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00bb75d8;
  dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::set_empty_key(&(this->
                   super_BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ).ht_.rep,&kEmptyInt);
  return;
}

Assistant:

explicit HashtableInterface_DenseHashMap(
      typename p::size_type expected_max_items = 0,
      const typename p::hasher& hf = typename p::hasher(),
      const typename p::key_equal& eql = typename p::key_equal(),
      const typename p::allocator_type& alloc = typename p::allocator_type())
      : BaseHashtableInterface<ht>(expected_max_items, hf, eql, alloc) {
    this->set_empty_key(EMPTY_KEY);
  }